

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O2

__pid_t __thiscall QThread::wait(QThread *this,void *__stat_loc)

{
  QThreadPrivate *this_00;
  __pid_t _Var1;
  undefined8 unaff_RBP;
  long in_FS_OFFSET;
  QMessageLogger local_60;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QThreadPrivate *)(this->super_QObject).d_ptr.d;
  local_40._0_8_ = &this_00->mutex;
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_40._0_8_);
  local_40[8] = true;
  _Var1 = (__pid_t)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if ((this_00->threadState != NotStarted) && (this_00->threadState != Finished)) {
    if (*(QObjectData **)(in_FS_OFFSET + 0x10) == (this->super_QObject).d_ptr.d[2].q_ptr[5].d_ptr.d)
    {
      local_60.context.version = 2;
      local_60.context.function._4_4_ = 0;
      local_60.context._4_8_ = 0;
      local_60.context._12_8_ = 0;
      local_60.context.category = "default";
      QMessageLogger::warning(&local_60,"QThread::wait: Thread tried to wait on itself");
      _Var1 = 0;
    }
    else {
      _Var1 = QThreadPrivate::wait(this_00,local_40);
    }
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return _Var1;
  }
  __stack_chk_fail();
}

Assistant:

bool QThread::wait(QDeadlineTimer deadline)
{
    Q_D(QThread);
    QMutexLocker locker(&d->mutex);

    if (d->threadState == QThreadPrivate::NotStarted || d->threadState == QThreadPrivate::Finished)
        return true;
    if (isCurrentThread()) {
        qWarning("QThread::wait: Thread tried to wait on itself");
        return false;
    }
    return d->wait(locker, deadline);
}